

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fetching.c
# Opt level: O1

int fetch_all_calendar_dates_db(feed_db_t *db,calendar_date_t **records)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  calendar_date_t *pcVar4;
  uchar *puVar5;
  long lVar6;
  long lVar7;
  char *pcVar8;
  byte bVar9;
  sqlite3_stmt *stmt;
  calendar_date_t record;
  char qr [63];
  sqlite3_stmt *local_d8;
  uint local_cc;
  calendar_date_t local_c8;
  char local_78 [72];
  
  bVar9 = 0;
  uVar2 = count_rows_db(db,"calendar_dates");
  if (0 < (int)uVar2) {
    builtin_strncpy(local_78 + 0x20,"on_type FROM `calendar_dates`;",0x1f);
    builtin_strncpy(local_78 + 0x10,"d, date, excepti",0x10);
    builtin_strncpy(local_78,"SELECT service_i",0x10);
    sqlite3_prepare_v2(db->conn,local_78,-1,&local_d8,(char **)0x0);
    pcVar4 = (calendar_date_t *)malloc((ulong)uVar2 * 0x50);
    *records = pcVar4;
    uVar1 = 0xffffffff;
    if (pcVar4 != (calendar_date_t *)0x0) {
      lVar7 = 0;
      local_cc = uVar2;
      do {
        iVar3 = sqlite3_step(local_d8);
        db->rc = iVar3;
        uVar1 = local_cc;
        if (iVar3 != 100) break;
        init_calendar_date(&local_c8);
        puVar5 = sqlite3_column_text(local_d8,0);
        strcpy(local_c8.service_id,(char *)puVar5);
        puVar5 = sqlite3_column_text(local_d8,1);
        strcpy(local_c8.date,(char *)puVar5);
        local_c8.exception_type = sqlite3_column_int(local_d8,2);
        pcVar4 = &local_c8;
        pcVar8 = (*records)->service_id + lVar7;
        for (lVar6 = 0x14; lVar6 != 0; lVar6 = lVar6 + -1) {
          *(undefined4 *)pcVar8 = *(undefined4 *)pcVar4->service_id;
          pcVar4 = (calendar_date_t *)((long)pcVar4 + (ulong)bVar9 * -8 + 4);
          pcVar8 = pcVar8 + ((ulong)bVar9 * -2 + 1) * 4;
        }
        lVar7 = lVar7 + 0x50;
        uVar1 = local_cc;
      } while ((ulong)uVar2 * 0x50 != lVar7);
    }
    uVar2 = uVar1;
    sqlite3_finalize(local_d8);
  }
  return uVar2;
}

Assistant:

int fetch_all_calendar_dates_db(feed_db_t *db, calendar_date_t **records) {

    calendar_date_t record;
    feed_db_status_t res;

    int record_count = count_rows_db(db, "calendar_dates");
    int i = 0;

    if (record_count < 1) {
        return record_count;
    }

    sqlite3_stmt *stmt;
    char qr[] = "SELECT "
                    "service_id, date, exception_type "
                "FROM `calendar_dates`;";

    sqlite3_prepare_v2(db->conn, qr, -1, &stmt, NULL);

    *records = malloc(record_count * sizeof(**records));
    if (*records == NULL) {
        sqlite3_finalize(stmt);
        return -1;
    }

    while ((db->rc = sqlite3_step(stmt)) == SQLITE_ROW) {
        init_calendar_date(&record);

        strcpy(record.service_id, sqlite3_column_text(stmt, 0));
        strcpy(record.date, sqlite3_column_text(stmt, 1));
        record.exception_type = (exception_type_t)sqlite3_column_int(stmt, 2);

        (*records)[i] = record;
        i++;

        if (i >= record_count)
            break;
    }

    sqlite3_finalize(stmt);
    return record_count;
}